

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O3

void rw::d3d9::freeInstanceData(Geometry *geometry)

{
  InstanceDataHeader *pIVar1;
  
  pIVar1 = geometry->instData;
  if ((pIVar1 != (InstanceDataHeader *)0x0) && (pIVar1->platform == 9)) {
    geometry->instData = (InstanceDataHeader *)0x0;
    (*DAT_00149de0)(*(undefined8 *)(pIVar1 + 0x16));
    d3d::destroyIndexBuffer(*(void **)(pIVar1 + 4));
    d3d::destroyVertexBuffer(*(void **)(pIVar1 + 8));
    d3d::destroyVertexBuffer(*(void **)(pIVar1 + 0xe));
    (*DAT_00149de0)(*(undefined8 *)(pIVar1 + 0x1a));
    (*DAT_00149de0)(pIVar1);
    return;
  }
  return;
}

Assistant:

void
freeInstanceData(Geometry *geometry)
{
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D9)
		return;
	InstanceDataHeader *header =
		(InstanceDataHeader*)geometry->instData;
	geometry->instData = nil;
	destroyVertexDeclaration(header->vertexDeclaration);
	destroyIndexBuffer(header->indexBuffer);
	destroyVertexBuffer(header->vertexStream[0].vertexBuffer);
	destroyVertexBuffer(header->vertexStream[1].vertexBuffer);
	rwFree(header->inst);
	rwFree(header);
	return;
}